

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

UINT8 __thiscall VGMPlayer::SetDeviceOptions(VGMPlayer *this,UINT32 id,PLR_DEV_OPTS *devOpts)

{
  ulong __n;
  size_t sVar1;
  size_type sVar2;
  reference pvVar3;
  DEV_INFO *devInf;
  size_t devID;
  size_t optID;
  PLR_DEV_OPTS *devOpts_local;
  UINT32 id_local;
  VGMPlayer *this_local;
  
  sVar1 = DeviceID2OptionID(this,id);
  if (sVar1 == 0xffffffffffffffff) {
    this_local._7_1_ = 0x80;
  }
  else {
    memcpy(this->_devOpts + sVar1,devOpts,0xa0);
    __n = this->_optDevMap[sVar1];
    sVar2 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::size
                      (&this->_devices);
    if (__n < sVar2) {
      std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::operator[]
                (&this->_devices,__n);
      pvVar3 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::
               operator[](&this->_devices,__n);
      RefreshDevOptions(this,pvVar3,this->_devOpts + sVar1);
      pvVar3 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::
               operator[](&this->_devices,__n);
      RefreshMuting(this,pvVar3,&this->_devOpts[sVar1].muteOpts);
      pvVar3 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::
               operator[](&this->_devices,__n);
      RefreshPanning(this,pvVar3,&this->_devOpts[sVar1].panOpts);
    }
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UINT8 VGMPlayer::SetDeviceOptions(UINT32 id, const PLR_DEV_OPTS& devOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID] = devOpts;
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
	{
		DEV_INFO* devInf = &_devices[devID].base.defInf;
		RefreshDevOptions(_devices[devID], _devOpts[optID]);
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
		RefreshPanning(_devices[devID], _devOpts[optID].panOpts);
	}
	return 0x00;
}